

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

GetCommitmentResponseStruct * __thiscall
cfd::js::api::json::GetCommitmentResponse::ConvertToStruct
          (GetCommitmentResponseStruct *__return_storage_ptr__,GetCommitmentResponse *this)

{
  GetCommitmentResponse *this_local;
  GetCommitmentResponseStruct *result;
  
  GetCommitmentResponseStruct::GetCommitmentResponseStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(string *)&this->asset_commitment_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->amount_commitment,
             (string *)&this->amount_commitment_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

GetCommitmentResponseStruct GetCommitmentResponse::ConvertToStruct() const {  // NOLINT
  GetCommitmentResponseStruct result;
  result.asset_commitment = asset_commitment_;
  result.amount_commitment = amount_commitment_;
  result.ignore_items = ignore_items;
  return result;
}